

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::emit_dqt(jpeg_encoder *this)

{
  int iVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  jpeg_encoder *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = 1;
    if (this->m_num_components == '\x03') {
      iVar1 = 2;
    }
    if (iVar1 <= local_14) break;
    emit_marker(this,0xdb);
    emit_word(this,0x43);
    emit_byte(this,(uint8)local_14);
    for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
      emit_byte(this,(uint8)this->m_quantization_tables[local_14][local_18]);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dqt()
{
  for (int i = 0; i < ((m_num_components == 3) ? 2 : 1); i++)
  {
    emit_marker(M_DQT);
    emit_word(64 + 1 + 2);
    emit_byte(static_cast<uint8>(i));
    for (int j = 0; j < 64; j++)
      emit_byte(static_cast<uint8>(m_quantization_tables[i][j]));
  }
}